

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedContentModel.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::MixedContentModel::hasDups(MixedContentModel *this)

{
  QName *this_00;
  bool bVar1;
  ulong uVar2;
  XMLCh *str1;
  XMLCh *str2;
  XMLSize_t index;
  ulong uVar3;
  XMLSize_t iIndex;
  ulong uVar4;
  
  uVar2 = this->fCount;
  if (uVar2 == 1) {
    return false;
  }
  uVar3 = 0;
  do {
    if (uVar2 <= uVar3) {
      return false;
    }
    this_00 = this->fChildren[uVar3];
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      if (uVar3 != uVar4) {
        if (this->fDTD == true) {
          str1 = QName::getRawName(this_00);
          str2 = QName::getRawName(this->fChildren[uVar4]);
        }
        else {
          if (this_00->fURIId != this->fChildren[uVar4]->fURIId) goto LAB_002e68a4;
          str1 = this_00->fLocalPart;
          str2 = this->fChildren[uVar4]->fLocalPart;
        }
        bVar1 = XMLString::equals(str1,str2);
        if (bVar1) {
          return true;
        }
      }
LAB_002e68a4:
      uVar2 = this->fCount;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

bool MixedContentModel::hasDups() const
{
    // Can't have dups if only one child
    if (fCount == 1)
        return false;

    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const QName* curVal = fChildren[index];
        for (XMLSize_t iIndex = 0; iIndex < fCount; iIndex++)
        {
            if (iIndex == index)
                continue;

            if (fDTD) {
                if (XMLString::equals(curVal->getRawName(), fChildren[iIndex]->getRawName())) {
                    return true;
                }
            }
            else {
                if ((curVal->getURI() == fChildren[iIndex]->getURI()) &&
                    (XMLString::equals(curVal->getLocalPart(), fChildren[iIndex]->getLocalPart()))) {
                    return true;
                }
            }
        }
    }
    return false;
}